

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldump.c
# Opt level: O0

int luaU_dump(lua_State *L,Proto *f,lua_Writer w,void *data,int strip)

{
  StkId pSVar1;
  Table *x_;
  TValue *io;
  DumpState D;
  int strip_local;
  void *data_local;
  lua_Writer w_local;
  Proto *f_local;
  lua_State *L_local;
  
  D.nstr._4_4_ = strip;
  D._32_8_ = luaH_new(L);
  pSVar1 = (L->top).p;
  *(undefined8 *)pSVar1 = D._32_8_;
  (pSVar1->val).tt_ = 'E';
  (L->top).p = (StkId)((L->top).offset + 0x10);
  D.data = (void *)0x0;
  D.offset._0_4_ = D.nstr._4_4_;
  D.offset._4_4_ = 0;
  D.h = (Table *)0x0;
  io = (TValue *)L;
  D.L = (lua_State *)w;
  D.writer = (lua_Writer)data;
  dumpHeader((DumpState *)&io);
  dumpByte((DumpState *)&io,f->sizeupvalues);
  dumpFunction((DumpState *)&io,f);
  dumpBlock((DumpState *)&io,(void *)0x0,0);
  return D.offset._4_4_;
}

Assistant:

int luaU_dump (lua_State *L, const Proto *f, lua_Writer w, void *data,
               int strip) {
  DumpState D;
  D.h = luaH_new(L);  /* aux. table to keep strings already dumped */
  sethvalue2s(L, L->top.p, D.h);  /* anchor it */
  L->top.p++;
  D.L = L;
  D.writer = w;
  D.offset = 0;
  D.data = data;
  D.strip = strip;
  D.status = 0;
  D.nstr = 0;
  dumpHeader(&D);
  dumpByte(&D, f->sizeupvalues);
  dumpFunction(&D, f);
  dumpBlock(&D, NULL, 0);  /* signal end of dump */
  return D.status;
}